

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O0

void __thiscall
miniros::Publication::Publication
          (Publication *this,string *name,string *datatype,string *_md5sum,
          string *message_definition,size_t max_queue,bool latch,bool has_header)

{
  undefined1 in_CL;
  undefined7 in_register_00000009;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  SerializedMessage *this_00;
  string *in_R8;
  undefined8 in_R9;
  byte in_stack_00000008;
  byte in_stack_00000010;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RDX);
  std::__cxx11::string::string(in_RDI + 0x40,(string *)CONCAT71(in_register_00000009,in_CL));
  std::__cxx11::string::string(in_RDI + 0x60,in_R8);
  *(undefined8 *)(in_RDI + 0x80) = in_R9;
  *(undefined4 *)(in_RDI + 0x88) = 0;
  std::mutex::mutex((mutex *)0x4884aa);
  std::
  vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
  ::vector((vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
            *)0x4884bf);
  std::mutex::mutex((mutex *)0x4884d0);
  this_00 = (SerializedMessage *)(in_RDI + 0xf8);
  std::
  vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
  ::vector((vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
            *)0x4884e6);
  std::mutex::mutex((mutex *)0x4884f7);
  in_RDI[0x138] = (string)0x0;
  in_RDI[0x139] = (string)(in_stack_00000008 & 1);
  in_RDI[0x13a] = (string)(in_stack_00000010 & 1);
  SerializedMessage::SerializedMessage(this_00);
  *(undefined4 *)(in_RDI + 0x178) = 0;
  std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>::vector
            ((vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_> *)
             0x488544);
  std::mutex::mutex((mutex *)0x488555);
  return;
}

Assistant:

Publication::Publication(const std::string &name,
                         const std::string &datatype,
                         const std::string &_md5sum,
                         const std::string& message_definition,
                         size_t max_queue,
                         bool latch,
                         bool has_header)
: name_(name),
  datatype_(datatype),
  md5sum_(_md5sum),
  message_definition_(message_definition),
  max_queue_(max_queue),
  seq_(0),
  dropped_(false),
  latch_(latch),
  has_header_(has_header),
  intraprocess_subscriber_count_(0)
{
}